

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# torrent.cpp
# Opt level: O2

void __thiscall
libtorrent::aux::torrent::set_limit_impl(torrent *this,int limit,int channel,bool state_update)

{
  int iVar1;
  undefined4 extraout_var;
  peer_class *ppVar2;
  int limit_00;
  
  limit_00 = 0;
  if (0x80000001 < limit + 0x80000001U) {
    limit_00 = limit;
  }
  if ((this->m_peer_class).m_val == 0) {
    if (limit_00 == 0) {
      return;
    }
    setup_peer_class(this);
  }
  iVar1 = (*(((this->super_torrent_hot_members).m_ses)->super_session_logger)._vptr_session_logger
            [0x32])();
  ppVar2 = peer_class_pool::at((peer_class_pool *)CONCAT44(extraout_var,iVar1),
                               (peer_class_t)(this->m_peer_class).m_val);
  if ((&ppVar2->priority)[(long)channel * 3 + -5]._M_elems[0] == limit_00) {
    return;
  }
  if (state_update) {
    state_updated(this);
    set_need_save_resume(this,(resume_data_flags_t)0x20);
  }
  bandwidth_channel::throttle
            ((bandwidth_channel *)(&ppVar2->priority + (long)channel * 3 + -7),limit_00);
  return;
}

Assistant:

void torrent::set_limit_impl(int limit, int const channel, bool const state_update)
	{
		TORRENT_ASSERT(is_single_thread());
		if (limit <= 0 || limit == aux::bandwidth_channel::inf) limit = 0;

		if (m_peer_class == peer_class_t{0})
		{
			if (limit == 0) return;
			setup_peer_class();
		}

		struct peer_class* tpc = m_ses.peer_classes().at(m_peer_class);
		TORRENT_ASSERT(tpc);
		if (tpc->channel[channel].throttle() == limit) return;
		if (state_update)
		{
			state_updated();
			set_need_save_resume(torrent_handle::if_config_changed);
		}
		tpc->channel[channel].throttle(limit);
	}